

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  undefined4 extraout_var;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool local_355;
  value_type local_338;
  cmCPackComponent *child;
  string *depend;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_308;
  undefined1 local_2e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependsVector;
  char *depends;
  reference local_2a0;
  string *installType;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_278;
  undefined1 local_258 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  char *installTypes;
  char *local_1f8;
  char *description;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  char *local_1a8;
  char *groupName;
  char *local_180;
  char *plist;
  char *local_158;
  char *archiveFile;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  char *displayName;
  string local_70;
  undefined1 local_50 [8];
  string macroPrefix;
  cmCPackComponent *component;
  bool hasComponent;
  string *name_local;
  string *projectName_local;
  cmCPackGenerator *this_local;
  
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::count(&this->Components,name);
  macroPrefix.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::operator[](&this->Components,name);
  if (sVar3 == 0) {
    cmsys::SystemTools::UpperCase(&local_70,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "CPACK_COMPONENT_",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::operator=((string *)macroPrefix.field_2._8_8_,(string *)name);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISPLAY_NAME");
    pcVar4 = GetOption(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_88 = pcVar4;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      std::__cxx11::string::operator=
                ((string *)(macroPrefix.field_2._8_8_ + 0x20),(string *)macroPrefix.field_2._8_8_);
    }
    else {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x20),pcVar4);
    }
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_HIDDEN");
    bVar1 = IsOn(this,&local_c8);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfd | bVar1 * '\x02';
    std::__cxx11::string::~string((string *)&local_c8);
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_REQUIRED");
    bVar1 = IsOn(this,&local_e8);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfe | bVar1;
    std::__cxx11::string::~string((string *)&local_e8);
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISABLED");
    bVar1 = IsOn(this,&local_108);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfb | bVar1 << 2;
    std::__cxx11::string::~string((string *)&local_108);
    archiveFile._6_1_ = 0;
    archiveFile._5_1_ = 0;
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DOWNLOADED");
    bVar1 = IsOn(this,&local_128);
    local_355 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      archiveFile._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"CPACK_DOWNLOAD_ALL",
                 (allocator<char> *)((long)&archiveFile + 7));
      archiveFile._5_1_ = 1;
      pcVar4 = GetOption(this,&local_148);
      local_355 = cmSystemTools::IsOn(pcVar4);
    }
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xf7 | local_355 << 3;
    if ((archiveFile._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_148);
    }
    if ((archiveFile._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&archiveFile + 7));
    }
    std::__cxx11::string::~string((string *)&local_128);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&plist,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_ARCHIVE_FILE");
    pcVar4 = GetOption(this,(string *)&plist);
    std::__cxx11::string::~string((string *)&plist);
    local_158 = pcVar4;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x88),pcVar4);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&groupName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_PLIST");
    pcVar4 = GetOption(this,(string *)&groupName);
    std::__cxx11::string::~string((string *)&groupName);
    local_180 = pcVar4;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0xa8),pcVar4);
    }
    std::operator+(&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_GROUP");
    pcVar4 = GetOption(this,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    local_1a8 = pcVar4;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      *(undefined8 *)(macroPrefix.field_2._8_8_ + 0x40) = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e8,pcVar4,(allocator<char> *)((long)&description + 7));
      iVar2 = (*this->_vptr_cmCPackGenerator[0x1c])(this,projectName,local_1e8);
      *(ulong *)(macroPrefix.field_2._8_8_ + 0x40) = CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&description + 7));
      std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                 (*(long *)(macroPrefix.field_2._8_8_ + 0x40) + 0x68),
                 (value_type *)((long)&macroPrefix.field_2 + 8));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &installTypes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DESCRIPTION");
    pcVar4 = GetOption(this,(string *)&installTypes);
    std::__cxx11::string::~string((string *)&installTypes);
    local_1f8 = pcVar4;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x50),pcVar4);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &installTypesVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_INSTALL_TYPES");
    pcVar4 = GetOption(this,(string *)
                            &installTypesVector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &installTypesVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_258);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,pcVar4,(allocator<char> *)((long)&__range3 + 7));
      cmSystemTools::ExpandListArgument
                (&local_278,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258,false);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_258);
      installType = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&installType), bVar1) {
        local_2a0 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        this_00 = (vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                  (macroPrefix.field_2._8_8_ + 0x70);
        iVar2 = (*this->_vptr_cmCPackGenerator[0x1a])(this,projectName,local_2a0);
        depends = (char *)CONCAT44(extraout_var_00,iVar2);
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
        push_back(this_00,(value_type *)&depends);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dependsVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DEPENDS");
    pcVar4 = GetOption(this,(string *)
                            &dependsVector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &dependsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,pcVar4,(allocator<char> *)((long)&__range3_1 + 7));
      cmSystemTools::ExpandListArgument
                (&local_308,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e8,false);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2e8);
      depend = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2e8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&depend), bVar1) {
        child = (cmCPackComponent *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end3_1);
        iVar2 = (*this->_vptr_cmCPackGenerator[0x1b])(this,projectName,child);
        local_338 = (value_type)CONCAT44(extraout_var_01,iVar2);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                   (macroPrefix.field_2._8_8_ + 200),&local_338);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  (&local_338->ReverseDependencies,(value_type *)((long)&macroPrefix.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return (cmCPackComponent *)macroPrefix.field_2._8_8_;
}

Assistant:

cmCPackComponent* cmCPackGenerator::GetComponent(
  const std::string& projectName, const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent* component = &this->Components[name];
  if (!hasComponent) {
    // Define the component
    std::string macroPrefix =
      "CPACK_COMPONENT_" + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    const char* displayName = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName) {
      component->DisplayName = displayName;
    } else {
      component->DisplayName = component->Name;
    }
    component->IsHidden = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded = this->IsOn(macroPrefix + "_DOWNLOADED") ||
      cmSystemTools::IsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    const char* archiveFile = this->GetOption(macroPrefix + "_ARCHIVE_FILE");
    if (archiveFile && *archiveFile) {
      component->ArchiveFile = archiveFile;
    }

    const char* plist = this->GetOption(macroPrefix + "_PLIST");
    if (plist && *plist) {
      component->Plist = plist;
    }

    const char* groupName = this->GetOption(macroPrefix + "_GROUP");
    if (groupName && *groupName) {
      component->Group = GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
    } else {
      component->Group = nullptr;
    }

    const char* description = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (description && *description) {
      component->Description = description;
    }

    // Determine the installation types.
    const char* installTypes = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (installTypes && *installTypes) {
      std::vector<std::string> installTypesVector;
      cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
      for (std::string const& installType : installTypesVector) {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, installType));
      }
    }

    // Determine the component dependencies.
    const char* depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (depends && *depends) {
      std::vector<std::string> dependsVector;
      cmSystemTools::ExpandListArgument(depends, dependsVector);
      for (std::string const& depend : dependsVector) {
        cmCPackComponent* child = GetComponent(projectName, depend);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
      }
    }
  }
  return component;
}